

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O3

void __thiscall
FIX::double_conversion::Bignum::AssignPowerUInt16(Bignum *this,uint16_t base,int power_exponent)

{
  uint uVar1;
  ulong value;
  uint uVar2;
  uint uVar3;
  undefined6 in_register_00000032;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  uint factor;
  bool bVar8;
  
  if ((int)CONCAT62(in_register_00000032,base) == 0) {
    __assert_fail("base != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x19d,"void FIX::double_conversion::Bignum::AssignPowerUInt16(uint16_t, int)");
  }
  if (power_exponent < 0) {
    __assert_fail("power_exponent >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x19e,"void FIX::double_conversion::Bignum::AssignPowerUInt16(uint16_t, int)");
  }
  if (power_exponent == 0) {
    AssignUInt16(this,1);
    return;
  }
  uVar4 = CONCAT62(in_register_00000032,base) & 0xffffffff;
  Zero(this);
  if ((base & 1) == 0) {
    iVar7 = 0;
    do {
      uVar4 = (uVar4 & 0xffff) >> 1;
      iVar7 = iVar7 + 1;
      factor = (uint)uVar4;
    } while ((uVar4 & 1) == 0);
  }
  else {
    factor = (uint)base;
    iVar7 = 0;
  }
  uVar1 = 0x1f;
  if (factor != 0) {
    for (; factor >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  if (0xde3 < (0x20 - (uVar1 ^ 0x1f)) * power_exponent) {
    abort();
  }
  uVar2 = 1;
  do {
    uVar3 = uVar2;
    uVar2 = uVar3 * 2;
  } while ((int)uVar3 <= power_exponent);
  uVar2 = uVar3 >> 2;
  uVar4 = uVar4 & 0xffff;
  if (uVar3 < 4) {
    AssignUInt64(this,uVar4);
  }
  else {
    bVar6 = false;
    value = uVar4;
    uVar3 = uVar2;
    do {
      value = value * value;
      if ((uVar3 & power_exponent) != 0) {
        bVar8 = value >> ((byte)(uVar1 ^ 0x1f) & 0x3f | 0x20) != 0;
        uVar5 = 1;
        if (!bVar8) {
          uVar5 = uVar4;
        }
        value = value * uVar5;
        bVar6 = (bool)(bVar6 | bVar8);
      }
      uVar2 = uVar3 >> 1;
    } while ((1 < uVar3) && (uVar3 = uVar2, value >> 0x20 == 0));
    AssignUInt64(this,value);
    if (bVar6) {
      MultiplyByUInt32(this,factor);
    }
  }
  if (uVar2 != 0) {
    do {
      Square(this);
      if ((uVar2 & power_exponent) != 0) {
        MultiplyByUInt32(this,factor);
      }
      bVar6 = 1 < uVar2;
      uVar2 = uVar2 >> 1;
    } while (bVar6);
  }
  ShiftLeft(this,iVar7 * power_exponent);
  return;
}

Assistant:

void Bignum::AssignPowerUInt16(uint16_t base, int power_exponent) {
  ASSERT(base != 0);
  ASSERT(power_exponent >= 0);
  if (power_exponent == 0) {
    AssignUInt16(1);
    return;
  }
  Zero();
  int shifts = 0;
  // We expect base to be in range 2-32, and most often to be 10.
  // It does not make much sense to implement different algorithms for counting
  // the bits.
  while ((base & 1) == 0) {
    base >>= 1;
    shifts++;
  }
  int bit_size = 0;
  int tmp_base = base;
  while (tmp_base != 0) {
    tmp_base >>= 1;
    bit_size++;
  }
  int final_size = bit_size * power_exponent;
  // 1 extra bigit for the shifting, and one for rounded final_size.
  EnsureCapacity(final_size / kBigitSize + 2);

  // Left to Right exponentiation.
  int mask = 1;
  while (power_exponent >= mask) mask <<= 1;

  // The mask is now pointing to the bit above the most significant 1-bit of
  // power_exponent.
  // Get rid of first 1-bit;
  mask >>= 2;
  uint64_t this_value = base;

  bool delayed_multipliciation = false;
  const uint64_t max_32bits = 0xFFFFFFFF;
  while (mask != 0 && this_value <= max_32bits) {
    this_value = this_value * this_value;
    // Verify that there is enough space in this_value to perform the
    // multiplication.  The first bit_size bits must be 0.
    if ((power_exponent & mask) != 0) {
      uint64_t base_bits_mask =
          ~((static_cast<uint64_t>(1) << (64 - bit_size)) - 1);
      bool high_bits_zero = (this_value & base_bits_mask) == 0;
      if (high_bits_zero) {
        this_value *= base;
      } else {
        delayed_multipliciation = true;
      }
    }
    mask >>= 1;
  }
  AssignUInt64(this_value);
  if (delayed_multipliciation) {
    MultiplyByUInt32(base);
  }

  // Now do the same thing as a bignum.
  while (mask != 0) {
    Square();
    if ((power_exponent & mask) != 0) {
      MultiplyByUInt32(base);
    }
    mask >>= 1;
  }

  // And finally add the saved shifts.
  ShiftLeft(shifts * power_exponent);
}